

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

bool __thiscall re2::DFA::AnalyzeSearch(DFA *this,SearchParams *params)

{
  char *pcVar1;
  char *pcVar2;
  uint8 c;
  bool bVar3;
  uint uVar4;
  uint8 *puVar5;
  uint flags;
  StartInfo *info;
  LogMessageFatal local_1a0;
  
  pcVar1 = (params->text).ptr_;
  pcVar2 = (params->context).ptr_;
  if (pcVar1 < pcVar2) {
LAB_0011fe59:
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x64e);
    std::operator<<((ostream *)&local_1a0.super_LogMessage.str_,"Text is not inside context.");
    LogMessageFatal::~LogMessageFatal(&local_1a0);
    params->start = (State *)0x1;
    return true;
  }
  puVar5 = (uint8 *)(pcVar1 + (params->text).length_);
  if (pcVar2 + (params->context).length_ < puVar5) goto LAB_0011fe59;
  if (params->run_forward == true) {
    if (pcVar1 == pcVar2) {
LAB_0011febd:
      flags = 5;
      uVar4 = 0;
      goto LAB_0011fede;
    }
    c = pcVar1[-1];
  }
  else {
    if (puVar5 == (uint8 *)(pcVar2 + (params->context).length_)) goto LAB_0011febd;
    c = *puVar5;
  }
  if (c == '\n') {
    flags = 1;
    uVar4 = 2;
  }
  else {
    bVar3 = Prog::IsWordChar(c);
    uVar4 = (uint)!bVar3 * 2 + 4;
    flags = (uint)bVar3 << 0xd;
  }
LAB_0011fede:
  if ((params->anchored != false) || (this->prog_->anchor_start_ == true)) {
    uVar4 = uVar4 | 1;
  }
  info = (StartInfo *)((long)&this->start_[0].start + (ulong)(uVar4 << 4));
  bVar3 = AnalyzeSearchHelper(this,params,info,flags);
  if (!bVar3) {
    ResetCache(this,params->cache_lock);
    bVar3 = AnalyzeSearchHelper(this,params,info,flags);
    if (!bVar3) {
      LogMessageFatal::LogMessageFatal
                (&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x67d
                );
      std::operator<<((ostream *)&local_1a0.super_LogMessage.str_,"Failed to analyze start state.");
      LogMessageFatal::~LogMessageFatal(&local_1a0);
      params->failed = true;
      return false;
    }
  }
  params->start = info->start;
  params->firstbyte =
       *(int *)((long)&this->start_[0].firstbyte.super___atomic_base<int>._M_i + (ulong)(uVar4 << 4)
               );
  return true;
}

Assistant:

bool DFA::AnalyzeSearch(SearchParams* params) {
  const StringPiece& text = params->text;
  const StringPiece& context = params->context;

  // Sanity check: make sure that text lies within context.
  if (text.begin() < context.begin() || text.end() > context.end()) {
    LOG(DFATAL) << "Text is not inside context.";
    params->start = DeadState;
    return true;
  }

  // Determine correct search type.
  int start;
  uint flags;
  if (params->run_forward) {
    if (text.begin() == context.begin()) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (text.begin()[-1] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(text.begin()[-1] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  } else {
    if (text.end() == context.end()) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (text.end()[0] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(text.end()[0] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  }
  if (params->anchored || prog_->anchor_start())
    start |= kStartAnchored;
  StartInfo* info = &start_[start];

  // Try once without cache_lock for writing.
  // Try again after resetting the cache
  // (ResetCache will relock cache_lock for writing).
  if (!AnalyzeSearchHelper(params, info, flags)) {
    ResetCache(params->cache_lock);
    if (!AnalyzeSearchHelper(params, info, flags)) {
      LOG(DFATAL) << "Failed to analyze start state.";
      params->failed = true;
      return false;
    }
  }

  if (DebugDFA)
    fprintf(stderr, "anchored=%d fwd=%d flags=%#x state=%s firstbyte=%d\n",
            params->anchored, params->run_forward, flags,
            DumpState(info->start).c_str(), info->firstbyte.load());

  params->start = info->start;
  params->firstbyte = info->firstbyte.load(std::memory_order_acquire);

  return true;
}